

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

void __thiscall
btHashedOverlappingPairCache::btHashedOverlappingPairCache(btHashedOverlappingPairCache *this)

{
  undefined8 *in_RDI;
  btHashedOverlappingPairCache *in_stack_00000010;
  int initialAllocatedSize;
  btAlignedObjectArray<btBroadphasePair> *in_stack_ffffffffffffffd0;
  btAlignedObjectArray<int> *this_00;
  btAlignedObjectArray<btBroadphasePair> *this_01;
  
  btOverlappingPairCache::btOverlappingPairCache
            ((btOverlappingPairCache *)in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__btHashedOverlappingPairCache_002e2140;
  this_01 = (btAlignedObjectArray<btBroadphasePair> *)(in_RDI + 1);
  btAlignedObjectArray<btBroadphasePair>::btAlignedObjectArray(in_stack_ffffffffffffffd0);
  in_RDI[5] = 0;
  this_00 = (btAlignedObjectArray<int> *)(in_RDI + 6);
  btAlignedObjectArray<int>::btAlignedObjectArray(this_00);
  btAlignedObjectArray<int>::btAlignedObjectArray(this_00);
  in_RDI[0xe] = 0;
  btAlignedObjectArray<btBroadphasePair>::reserve(this_01,(int)((ulong)in_RDI >> 0x20));
  growTables(in_stack_00000010);
  return;
}

Assistant:

btHashedOverlappingPairCache::btHashedOverlappingPairCache():
	m_overlapFilterCallback(0),
	m_ghostPairCallback(0)
{
	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
	growTables();
}